

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O1

bool __thiscall
glcts::anon_unknown_0::BasicResourceAtomicCounter::RunIteration
          (BasicResourceAtomicCounter *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  CallLogWrapper *this_00;
  bool bVar1;
  int i;
  GLuint GVar2;
  long lVar3;
  ostream *poVar4;
  undefined4 *puVar5;
  uint *puVar6;
  void *pvVar7;
  undefined7 in_register_00000009;
  bool *compile_error;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uvec3 global_size;
  int local_1f8 [3];
  undefined4 local_1ec;
  GLuint *local_1e8;
  GLuint *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  local_1f8[2] = 0;
  local_1f8[0] = 0;
  local_1f8[1] = 0;
  lVar3 = 0;
  do {
    local_1f8[lVar3] = num_groups->m_data[lVar3] * param_1->m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\nlayout(local_size_x = ",0x17);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", local_size_y = ",0x11);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", local_size_z = ",0x11);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,") in;\nlayout(std430, binding = 0) buffer Output {\n  uint inc_data[",0x42);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"];\n  uint dec_data[",0x13);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "];\n};\nlayout(binding = 0, offset = 0) uniform atomic_uint g_inc_counter;\nlayout(binding = 0, offset = 4) uniform atomic_uint g_dec_counter;\nvoid main() {\n  uint index = atomicCounterIncrement(g_inc_counter);\n  inc_data[index] = index;\n  dec_data[index] = atomicCounterDecrement(g_dec_counter);\n}"
             ,0x127);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_1d8);
  this->m_program = GVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  if (bVar1) {
    local_1ec = (undefined4)CONCAT71(in_register_00000009,dispatch_indirect);
    uVar9 = num_groups->m_data[0] * param_1->m_data[0] * param_1->m_data[1] * num_groups->m_data[1]
            * param_1->m_data[2] * num_groups->m_data[2];
    if (this->m_storage_buffer == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
    }
    local_1e8 = &this->m_storage_buffer;
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer);
    uVar10 = (ulong)uVar9;
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,uVar10 * 8,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
    local_1e0 = &this->m_counter_buffer;
    if (this->m_counter_buffer == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,local_1e0);
    }
    glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,0,this->m_counter_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x92c0,8,(void *)0x0,0x88e0);
    puVar5 = (undefined4 *)glu::CallLogWrapper::glMapBufferRange(this_00,0x92c0,0,4,2);
    *puVar5 = 0;
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x92c0);
    puVar6 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x92c0,4,4,2);
    *puVar6 = uVar9;
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x92c0);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    if ((char)local_1ec == '\0') {
      glu::CallLogWrapper::glDispatchCompute
                (this_00,num_groups->m_data[0],num_groups->m_data[1],num_groups->m_data[2]);
    }
    else {
      if (this->m_dispatch_buffer == 0) {
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
      }
      glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,this->m_dispatch_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,num_groups,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
    }
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*local_1e8);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    pvVar7 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,uVar10 * 4,1);
    if (uVar9 == 0) {
      bVar1 = true;
    }
    else {
      bVar1 = true;
      uVar11 = 0;
      do {
        uVar8 = (ulong)*(uint *)((long)pvVar7 + uVar11 * 4);
        if (uVar11 != uVar8) {
          bVar1 = false;
          anon_unknown_0::Output
                    ("Value at index %d is %d should be %d.\n",uVar11 & 0xffffffff,uVar8,
                     uVar11 & 0xffffffff);
        }
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,*local_1e0);
    puVar6 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x92c0,0,8,1);
    if (*puVar6 != uVar9) {
      bVar1 = false;
      anon_unknown_0::Output
                ("Final atomic counter value (buffer 0, offset 0) is %d should be %d.\n");
    }
    if (puVar6[1] != 0) {
      bVar1 = false;
      anon_unknown_0::Output
                ("Final atomic counter value (buffer 0, offset 4) is %d should be %d.\n",
                 (ulong)puVar6[1],0);
    }
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x92c0);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		const GLint  kWidth  = static_cast<GLint>(local_size.x() * num_groups.x());
		const GLint  kHeight = static_cast<GLint>(local_size.y() * num_groups.y());
		const GLint  kDepth  = static_cast<GLint>(local_size.z() * num_groups.z());
		const GLuint kSize   = kWidth * kHeight * kDepth;

		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(GLuint) * kSize * 2, NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		if (m_counter_buffer == 0)
			glGenBuffers(1, &m_counter_buffer);

		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, m_counter_buffer);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 2 * sizeof(GLuint), NULL, GL_STREAM_DRAW);
		*static_cast<GLuint*>(glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, sizeof(GLuint), GL_MAP_WRITE_BIT)) = 0;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
		*static_cast<GLuint*>(
			glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, sizeof(GLuint), sizeof(GLuint), GL_MAP_WRITE_BIT)) = kSize;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}

		GLuint* data;
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		data = static_cast<GLuint*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLuint) * kSize, GL_MAP_READ_BIT));

		bool ret = true;
		for (GLuint i = 0; i < kSize; ++i)
		{
			if (data[i] != i)
			{
				Output("Value at index %d is %d should be %d.\n", i, data[i], i);
				ret = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		GLuint* value;
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, m_counter_buffer);
		value =
			static_cast<GLuint*>(glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, 2 * sizeof(GLuint), GL_MAP_READ_BIT));
		if (value[0] != kSize)
		{
			Output("Final atomic counter value (buffer 0, offset 0) is %d should be %d.\n", value[0], kSize);
			ret = false;
		}
		if (value[1] != 0)
		{
			Output("Final atomic counter value (buffer 0, offset 4) is %d should be %d.\n", value[1], 0);
			ret = false;
		}
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		return ret;
	}